

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TVarEntryInfo::TOrderByPriority::operator()
          (TOrderByPriority *this,TVarEntryInfo *l,TVarEntryInfo *r)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int rPoints;
  int lPoints;
  TQualifier *rq;
  TQualifier *lq;
  TVarEntryInfo *r_local;
  TVarEntryInfo *l_local;
  TOrderByPriority *this_local;
  
  iVar5 = (*(l->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  iVar6 = (*(r->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
  bVar1 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var,iVar5));
  cVar2 = '\0';
  if (bVar1) {
    cVar2 = '\x02';
  }
  bVar1 = TQualifier::hasSet((TQualifier *)CONCAT44(extraout_var,iVar5));
  bVar3 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var_00,iVar6));
  cVar4 = '\0';
  if (bVar3) {
    cVar4 = '\x02';
  }
  bVar3 = TQualifier::hasSet((TQualifier *)CONCAT44(extraout_var_00,iVar6));
  if ((char)(cVar2 + bVar1) == (char)(cVar4 + bVar3)) {
    this_local._7_1_ = l->id < r->id;
  }
  else {
    this_local._7_1_ = (byte)(cVar4 + bVar3) < (byte)(cVar2 + bVar1);
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator()(const TVarEntryInfo& l, const TVarEntryInfo& r) {
            const TQualifier& lq = l.symbol->getQualifier();
            const TQualifier& rq = r.symbol->getQualifier();

            // simple rules:
            // has binding gives 2 points
            // has set gives 1 point
            // who has the most points is more important.
            int lPoints = (lq.hasBinding() ? 2 : 0) + (lq.hasSet() ? 1 : 0);
            int rPoints = (rq.hasBinding() ? 2 : 0) + (rq.hasSet() ? 1 : 0);

            if (lPoints == rPoints)
                return l.id < r.id;
            return lPoints > rPoints;
        }